

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void mbedtls_ssl_print_extensions
               (mbedtls_ssl_context *ssl,int level,char *file,int line,int hs_msg_type,
               uint32_t extensions_mask,char *extra)

{
  char *extra_msg0;
  uint local_30;
  uint i;
  uint32_t extensions_mask_local;
  int hs_msg_type_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  for (local_30 = 0; local_30 < 0x1d; local_30 = local_30 + 1) {
    extra_msg0 = "does not exist";
    if ((extensions_mask & 1 << ((byte)local_30 & 0x1f)) != 0) {
      extra_msg0 = "exists";
    }
    mbedtls_ssl_print_extension
              (ssl,level,file,line,hs_msg_type,extension_type_table[local_30],extra_msg0,extra);
  }
  return;
}

Assistant:

void mbedtls_ssl_print_extensions(const mbedtls_ssl_context *ssl,
                                  int level, const char *file, int line,
                                  int hs_msg_type, uint32_t extensions_mask,
                                  const char *extra)
{

    for (unsigned i = 0;
         i < sizeof(extension_name_table) / sizeof(extension_name_table[0]);
         i++) {
        mbedtls_ssl_print_extension(
            ssl, level, file, line, hs_msg_type, extension_type_table[i],
            extensions_mask & (1 << i) ? "exists" : "does not exist", extra);
    }
}